

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkInterface * __thiscall
cmGeneratorTarget::GetImportLinkInterface
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *headTarget,
          bool usage_requirements_only)

{
  bool bVar1;
  pointer ppVar2;
  byte local_c9;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_c0;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  cmOptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_> local_80;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
  local_78 [3];
  map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
  *local_60;
  cmHeadToLinkInterfaceMap *hm;
  string CONFIG;
  ImportInfo *info;
  cmGeneratorTarget *pcStack_28;
  bool usage_requirements_only_local;
  cmGeneratorTarget *headTarget_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  pcStack_28 = headTarget;
  headTarget_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  CONFIG.field_2._8_8_ = GetImportInfo(this,config);
  if ((ImportInfo *)CONFIG.field_2._8_8_ == (ImportInfo *)0x0) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&hm,(string *)headTarget_local);
    if (usage_requirements_only) {
      local_c0 = &GetHeadToLinkInterfaceUsageRequirementsMap(this,(string *)headTarget_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    else {
      local_c0 = &GetHeadToLinkInterfaceMap(this,(string *)headTarget_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
      ;
    }
    local_60 = local_c0;
    bVar1 = std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
            ::empty(local_c0);
    local_c9 = 0;
    if (!bVar1) {
      local_78[0]._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
           ::begin(local_60);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
               ::operator->(local_78);
      local_c9 = (ppVar2->second).super_cmLinkInterface.field_0x6c ^ 0xff;
    }
    if ((local_c9 & 1) == 0) {
      deps.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
                    ::operator[](local_60,&stack0xffffffffffffffd8);
      if (((((mapped_type *)
            deps.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_cmLinkInterface).field_0x6a &
          1) == 0) {
        (((mapped_type *)
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_cmLinkInterface).field_0x6a = 1;
        (((mapped_type *)
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_cmLinkInterface).Multiplicity =
             *(uint *)(CONFIG.field_2._8_8_ + 4);
        cmSystemTools::ExpandListArgument
                  ((string *)(CONFIG.field_2._8_8_ + 0x88),
                   &(((mapped_type *)
                     deps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_cmLinkInterface).
                    Languages,false);
        ExpandLinkItems(this,(string *)(CONFIG.field_2._8_8_ + 200),
                        (string *)(CONFIG.field_2._8_8_ + 0xa8),(string *)headTarget_local,
                        pcStack_28,usage_requirements_only,
                        (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                        deps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (bool *)((long)&deps.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage[3].
                                        _M_string_length + 4));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
        cmSystemTools::ExpandListArgument
                  ((string *)(CONFIG.field_2._8_8_ + 0xe8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,false);
        LookupLinkItems(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_a8,
                        (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                        &deps.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[1].field_2);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      }
      this_local = (cmGeneratorTarget *)
                   deps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    }
    else {
      local_80._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkInterface,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>_>
           ::begin(local_60);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkInterface>_>
               ::operator->(&local_80);
      this_local = (cmGeneratorTarget *)&ppVar2->second;
    }
    std::__cxx11::string::~string((string *)&hm);
  }
  return (cmLinkInterface *)this_local;
}

Assistant:

const cmLinkInterface* cmGeneratorTarget::GetImportLinkInterface(
  const std::string& config, cmGeneratorTarget const* headTarget,
  bool usage_requirements_only) const
{
  cmGeneratorTarget::ImportInfo const* info = this->GetImportInfo(config);
  if (!info) {
    return CM_NULLPTR;
  }

  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmHeadToLinkInterfaceMap& hm =
    (usage_requirements_only
       ? this->GetHeadToLinkInterfaceUsageRequirementsMap(config)
       : this->GetHeadToLinkInterfaceMap(config));

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkInterface& iface = hm[headTarget];
  if (!iface.AllDone) {
    iface.AllDone = true;
    iface.Multiplicity = info->Multiplicity;
    cmSystemTools::ExpandListArgument(info->Languages, iface.Languages);
    this->ExpandLinkItems(info->LibrariesProp, info->Libraries, config,
                          headTarget, usage_requirements_only, iface.Libraries,
                          iface.HadHeadSensitiveCondition);
    std::vector<std::string> deps;
    cmSystemTools::ExpandListArgument(info->SharedDeps, deps);
    this->LookupLinkItems(deps, iface.SharedDeps);
  }

  return &iface;
}